

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int gen_publickey_from_rsa_openssh_priv_data
              (LIBSSH2_SESSION *session,string_buf *decrypted,uchar **method,size_t *method_len,
              uchar **pubkeydata,size_t *pubkeydata_len,EVP_PKEY **rsa_ctx)

{
  int iVar1;
  char *errmsg;
  EVP_PKEY *rsa;
  uchar *d;
  uchar *e;
  uchar *n;
  size_t dlen;
  size_t elen;
  size_t nlen;
  uchar *comment;
  uchar *coeff;
  uchar *q;
  uchar *p;
  size_t commentlen;
  size_t coefflen;
  size_t qlen;
  size_t plen;
  uchar *in_stack_ffffffffffffff00;
  unsigned_long in_stack_ffffffffffffff08;
  uchar *in_stack_ffffffffffffff10;
  unsigned_long in_stack_ffffffffffffff18;
  uchar *in_stack_ffffffffffffff20;
  unsigned_long in_stack_ffffffffffffff28;
  uchar *in_stack_ffffffffffffff30;
  unsigned_long in_stack_ffffffffffffff38;
  uchar *in_stack_ffffffffffffff40;
  unsigned_long in_stack_ffffffffffffff48;
  EVP_PKEY *local_a8;
  uchar *local_a0;
  uchar *local_98;
  uchar *local_90;
  unsigned_long local_88;
  unsigned_long local_80;
  unsigned_long local_78;
  uchar *local_70;
  uchar *local_68;
  uchar *local_60;
  uchar *local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  local_a8 = (EVP_PKEY *)0x0;
  iVar1 = _libssh2_get_bignum_bytes(decrypted,&local_90,&local_78);
  if (iVar1 == 0) {
    iVar1 = _libssh2_get_bignum_bytes(decrypted,&local_98,&local_80);
    if (iVar1 == 0) {
      iVar1 = _libssh2_get_bignum_bytes(decrypted,&local_a0,&local_88);
      if (iVar1 == 0) {
        iVar1 = _libssh2_get_bignum_bytes(decrypted,&local_68,&local_48);
        if (iVar1 == 0) {
          iVar1 = _libssh2_get_bignum_bytes(decrypted,&local_58,&local_38);
          if (iVar1 == 0) {
            iVar1 = _libssh2_get_bignum_bytes(decrypted,&local_60,&local_40);
            if (iVar1 == 0) {
              iVar1 = _libssh2_get_string(decrypted,&local_70,&local_50);
              if (iVar1 == 0) {
                iVar1 = _libssh2_rsa_new((EVP_PKEY **)&local_a8,local_98,local_80,local_90,local_78,
                                         local_a0,local_88,in_stack_ffffffffffffff00,
                                         in_stack_ffffffffffffff08,in_stack_ffffffffffffff10,
                                         in_stack_ffffffffffffff18,in_stack_ffffffffffffff20,
                                         in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,
                                         in_stack_ffffffffffffff38,in_stack_ffffffffffffff40,
                                         in_stack_ffffffffffffff48);
                if (iVar1 != 0) {
                  if (local_a8 != (EVP_PKEY *)0x0) {
                    EVP_PKEY_free(local_a8);
                  }
                  iVar1 = _libssh2_error(session,-6,"Unable to allocate memory for private key data"
                                        );
                  return iVar1;
                }
                iVar1 = 0;
                if (((method != (uchar **)0x0) && (pubkeydata != (uchar **)0x0)) &&
                   (local_a8 != (EVP_PKEY *)0x0)) {
                  iVar1 = gen_publickey_from_rsa_evp
                                    (session,method,method_len,pubkeydata,pubkeydata_len,
                                     (EVP_PKEY *)local_a8);
                }
                if (rsa_ctx != (EVP_PKEY **)0x0) {
                  *rsa_ctx = (EVP_PKEY *)local_a8;
                  return iVar1;
                }
                EVP_PKEY_free(local_a8);
                return iVar1;
              }
              errmsg = "RSA no comment";
            }
            else {
              errmsg = "RSA no q";
            }
          }
          else {
            errmsg = "RSA no p";
          }
        }
        else {
          errmsg = "RSA no coeff";
        }
      }
      else {
        errmsg = "RSA no d";
      }
    }
    else {
      errmsg = "RSA no e";
    }
  }
  else {
    errmsg = "RSA no n";
  }
  _libssh2_error(session,-0xe,errmsg);
  return -1;
}

Assistant:

static int
gen_publickey_from_rsa_openssh_priv_data(LIBSSH2_SESSION *session,
                                         struct string_buf *decrypted,
                                         unsigned char **method,
                                         size_t *method_len,
                                         unsigned char **pubkeydata,
                                         size_t *pubkeydata_len,
                                         libssh2_rsa_ctx **rsa_ctx)
{
    int rc = 0;
    size_t nlen, elen, dlen, plen, qlen, coefflen, commentlen;
    unsigned char *n, *e, *d, *p, *q, *coeff, *comment;
    libssh2_rsa_ctx *rsa = NULL;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing RSA keys from private key data"));

    /* public key data */
    if(_libssh2_get_bignum_bytes(decrypted, &n, &nlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no n");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &e, &elen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no e");
        return -1;
    }

    /* private key data */
    if(_libssh2_get_bignum_bytes(decrypted, &d, &dlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no d");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &coeff, &coefflen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no coeff");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &p, &plen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no p");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &q, &qlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no q");
        return -1;
    }

    if(_libssh2_get_string(decrypted, &comment, &commentlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no comment");
        return -1;
    }

    rc = _libssh2_rsa_new(&rsa,
                          e, (unsigned long)elen,
                          n, (unsigned long)nlen,
                          d, (unsigned long)dlen,
                          p, (unsigned long)plen,
                          q, (unsigned long)qlen,
                          NULL, 0, NULL, 0,
                          coeff, (unsigned long)coefflen);
    if(rc) {
        _libssh2_debug((session,
                       LIBSSH2_TRACE_AUTH,
                       "Could not create RSA private key"));
        goto fail;
    }

#ifndef USE_OPENSSL_3
    if(rsa)
        rc = _libssh2_rsa_new_additional_parameters(rsa);
#endif

    if(rsa && pubkeydata && method) {
#ifdef USE_OPENSSL_3
        EVP_PKEY *pk = rsa;
#else
        EVP_PKEY *pk = EVP_PKEY_new();
        EVP_PKEY_set1_RSA(pk, rsa);
#endif

        rc = gen_publickey_from_rsa_evp(session, method, method_len,
                                        pubkeydata, pubkeydata_len,
                                        pk);

#ifndef USE_OPENSSL_3
        if(pk)
            EVP_PKEY_free(pk);
#endif
    }

    if(rsa_ctx)
        *rsa_ctx = rsa;
    else
        _libssh2_rsa_free(rsa);

    return rc;

fail:

    if(rsa)
        _libssh2_rsa_free(rsa);

    return _libssh2_error(session,
                          LIBSSH2_ERROR_ALLOC,
                          "Unable to allocate memory for private key data");
}